

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_basename(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  sxi32 sVar2;
  char *pcVar3;
  ulong uVar4;
  char *zString;
  char *pcVar5;
  long lVar6;
  int nLen;
  int iLen;
  int nSuffix;
  int local_30;
  sxu32 local_2c;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    pcVar3 = jx9_value_to_string(*apArg,&local_30);
    uVar4 = (ulong)local_30;
    if (0 < (long)uVar4) {
      pcVar5 = pcVar3 + uVar4;
      lVar1 = uVar4 << 0x20;
      do {
        lVar6 = lVar1;
        pcVar5 = pcVar5 + -1;
        local_30 = (int)uVar4;
        if (pcVar5 <= pcVar3) break;
        uVar4 = (ulong)(local_30 - 1);
        lVar1 = lVar6 + -0x100000000;
      } while (*pcVar5 == '/');
      for (; (pcVar3 < pcVar5 && (*pcVar5 != '/')); pcVar5 = pcVar5 + -1) {
      }
      zString = pcVar5 + 1;
      if (pcVar5 <= pcVar3) {
        zString = pcVar3;
      }
      pcVar3 = pcVar3 + (lVar6 >> 0x20);
      if ((nArg != 1) && ((apArg[1]->iFlags & 1) != 0)) {
        pcVar5 = jx9_value_to_string(apArg[1],(int *)&local_2c);
        if ((0 < (long)(int)local_2c) && ((int)local_2c < local_30)) {
          sVar2 = SyMemcmp(pcVar3 + -(long)(int)local_2c,pcVar5,local_2c);
          if (sVar2 == 0) {
            pcVar3 = pcVar3 + -(long)(int)local_2c;
          }
        }
      }
      nLen = (int)pcVar3 - (int)zString;
      goto LAB_00133fe9;
    }
  }
  zString = "";
  nLen = 0;
LAB_00133fe9:
  jx9_result_string(pCtx,zString,nLen);
  return 0;
}

Assistant:

static int jx9Builtin_basename(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zPath, *zBase, *zEnd;
	int c, d, iLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	c = d = '/';
#ifdef __WINNT__
	d = '\\';
#endif
	/* Point to the target path */
	zPath = jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	zEnd = &zPath[iLen - 1];
	/* Ignore trailing '/' */
	while( zEnd > zPath && ( (int)zEnd[0] == c || (int)zEnd[0] == d ) ){
		zEnd--;
	}
	iLen = (int)(&zEnd[1]-zPath);
	while( zEnd > zPath && ( (int)zEnd[0] != c && (int)zEnd[0] != d ) ){
		zEnd--;
	}
	zBase = (zEnd > zPath) ? &zEnd[1] : zPath;
	zEnd = &zPath[iLen];
	if( nArg > 1 && jx9_value_is_string(apArg[1]) ){
		const char *zSuffix;
		int nSuffix;
		/* Strip suffix */
		zSuffix = jx9_value_to_string(apArg[1], &nSuffix);
		if( nSuffix > 0 && nSuffix < iLen && SyMemcmp(&zEnd[-nSuffix], zSuffix, nSuffix) == 0 ){
			zEnd -= nSuffix;
		}
	}
	/* Store the basename */
	jx9_result_string(pCtx, zBase, (int)(zEnd-zBase));
	return JX9_OK;
}